

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IDeviceContext> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IDeviceContext>::operator=
          (RefCntAutoPtr<Diligent::IDeviceContext> *this,
          RefCntAutoPtr<Diligent::IDeviceContext> *AutoPtr)

{
  IDeviceContext *pObj;
  RefCntAutoPtr<Diligent::IDeviceContext> *AutoPtr_local;
  RefCntAutoPtr<Diligent::IDeviceContext> *this_local;
  
  if (this->m_pObject != AutoPtr->m_pObject) {
    pObj = Detach(AutoPtr);
    Attach(this,pObj);
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }